

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpexternaltransmitter.cpp
# Opt level: O0

int __thiscall
jrtplib::RTPExternalTransmitter::SetReceiveMode(RTPExternalTransmitter *this,ReceiveMode m)

{
  ReceiveMode m_local;
  RTPExternalTransmitter *this_local;
  
  if ((this->init & 1U) == 0) {
    this_local._4_4_ = -0x97;
  }
  else if ((this->created & 1U) == 0) {
    this_local._4_4_ = -0x96;
  }
  else if (m == AcceptAll) {
    this_local._4_4_ = 0;
  }
  else {
    this_local._4_4_ = -0x8e;
  }
  return this_local._4_4_;
}

Assistant:

int RTPExternalTransmitter::SetReceiveMode(RTPTransmitter::ReceiveMode m)
{
	if (!init)
		return ERR_RTP_EXTERNALTRANS_NOTINIT;
	
	MAINMUTEX_LOCK
	if (!created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_EXTERNALTRANS_NOTCREATED;
	}
	if (m != RTPTransmitter::AcceptAll)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_EXTERNALTRANS_BADRECEIVEMODE;
	}
	MAINMUTEX_UNLOCK
	return 0;
}